

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * __thiscall
AI::create_MoveToDestination
          (Task *__return_storage_ptr__,AI *this,float walkSpeed,Vector3 debugSphereColour,
          float acceptanceRadius,bool stopOnOverlap,bool usePathfinding,int parameterIndex)

{
  undefined3 in_register_00000009;
  float local_cc;
  float local_b4;
  value_type local_94;
  value_type local_8c;
  value_type_conflict1 local_80 [5];
  allocator<char> local_69;
  string local_68;
  undefined1 local_41;
  int local_40;
  byte local_3a;
  byte local_39;
  int parameterIndex_local;
  bool usePathfinding_local;
  float fStack_34;
  bool stopOnOverlap_local;
  float acceptanceRadius_local;
  float walkSpeed_local;
  float local_28;
  undefined8 local_20;
  Vector3 debugSphereColour_local;
  Task *moveToDestination;
  
  local_40 = CONCAT31(in_register_00000009,usePathfinding);
  local_28 = debugSphereColour.z;
  _acceptanceRadius_local = debugSphereColour._0_8_;
  local_39 = (byte)this & 1;
  local_41 = 0;
  local_3a = stopOnOverlap;
  parameterIndex_local = (int)acceptanceRadius;
  fStack_34 = walkSpeed;
  local_20 = _acceptanceRadius_local;
  debugSphereColour_local.x = local_28;
  unique0x1000019a = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"moveToDestination",&local_69);
  Task::Task(__return_storage_ptr__,&local_68,Simple);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  __return_storage_ptr__->action = MoveToDestination;
  std::vector<float,_std::allocator<float>_>::push_back
            (&(__return_storage_ptr__->parameters).values,&stack0xffffffffffffffcc);
  local_80[0] = 1.0;
  std::vector<float,_std::allocator<float>_>::push_back
            (&(__return_storage_ptr__->parameters).values,local_80);
  local_8c.x = (float)parameterIndex_local;
  local_b4 = 1.0;
  if ((local_39 & 1) == 0) {
    local_b4 = 0.0;
  }
  local_8c.y = local_b4;
  local_cc = 1.0;
  if ((local_3a & 1) == 0) {
    local_cc = 0.0;
  }
  local_8c.z = local_cc;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::push_back
            (&(__return_storage_ptr__->parameters).vectors,&local_8c);
  local_94.identifier = NearDestination;
  local_94.index = local_40;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back(&(__return_storage_ptr__->postconditions).satisfiedPredicates,&local_94);
  return __return_storage_ptr__;
}

Assistant:

Task create_MoveToDestination(float walkSpeed, Math::Vector3 debugSphereColour, float acceptanceRadius = 1.f, bool stopOnOverlap = true, bool usePathfinding = true, int parameterIndex = -1)
	{
		/*
		Parameters:
		values: 
		0 is walk speed
		1 is NeedsMoveToCalled
		*/
		Task moveToDestination {"moveToDestination"};
		moveToDestination.action = Action::MoveToDestination;
		moveToDestination.parameters.values.push_back(walkSpeed);
		moveToDestination.parameters.values.push_back(1.f);
		moveToDestination.parameters.vectors.push_back({acceptanceRadius, stopOnOverlap ? 1.f : 0.f, usePathfinding ? 1.f : 0.f});
		
		moveToDestination.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearDestination, parameterIndex});
		
		return moveToDestination;
	}